

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::AssertionResult::hasExpandedExpression(AssertionResult *this)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  bool bVar4;
  undefined1 *local_58;
  size_t local_50;
  undefined1 local_48 [16];
  string local_38;
  
  sVar1 = (this->m_info).capturedExpression._M_string_length;
  if (sVar1 != 0) {
    local_58 = local_48;
    pcVar2 = (this->m_resultData).reconstructedExpression._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar2,
               pcVar2 + (this->m_resultData).reconstructedExpression._M_string_length);
    getExpression_abi_cxx11_(&local_38,this);
    bVar4 = true;
    if (local_50 != local_38._M_string_length) goto LAB_00137262;
    if (local_50 != 0) {
      iVar3 = bcmp(local_58,local_38._M_dataplus._M_p,local_50);
      bVar4 = iVar3 != 0;
      goto LAB_00137262;
    }
  }
  bVar4 = false;
LAB_00137262:
  if (sVar1 != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
  }
  return bVar4;
}

Assistant:

bool compare( T* lhs, long rhs ) {
        return Evaluator<T*, T*, Op>::evaluate( lhs, reinterpret_cast<T*>( rhs ) );
    }